

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_166522e::AnyTargetCommandOutputMatches
          (anon_unknown_dwarf_166522e *this,string *name,
          vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *commands)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  long lVar3;
  cmCustomCommand *pcVar4;
  long lVar5;
  
  lVar3 = (long)commands - (long)name;
  lVar5 = (lVar3 >> 3) * 0x6f96f96f96f96f97 >> 2;
  if (0 < lVar5) {
    lVar5 = lVar5 + 1;
    do {
      pvVar2 = cmCustomCommand::GetByproducts_abi_cxx11_((cmCustomCommand *)name);
      bVar1 = AnyOutputMatches(this,(pvVar2->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)(pvVar2->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish);
      pcVar4 = (cmCustomCommand *)name;
      if (bVar1) goto LAB_003d18ee;
      pvVar2 = cmCustomCommand::GetByproducts_abi_cxx11_((cmCustomCommand *)((long)name + 0x138));
      bVar1 = AnyOutputMatches(this,(pvVar2->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)(pvVar2->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish);
      pcVar4 = (cmCustomCommand *)((long)name + 0x138);
      if (bVar1) goto LAB_003d18ee;
      pvVar2 = cmCustomCommand::GetByproducts_abi_cxx11_((cmCustomCommand *)((long)name + 0x270));
      bVar1 = AnyOutputMatches(this,(pvVar2->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)(pvVar2->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish);
      pcVar4 = (cmCustomCommand *)((long)name + 0x270);
      if (bVar1) goto LAB_003d18ee;
      pvVar2 = cmCustomCommand::GetByproducts_abi_cxx11_((cmCustomCommand *)((long)name + 0x3a8));
      bVar1 = AnyOutputMatches(this,(pvVar2->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)(pvVar2->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish);
      pcVar4 = (cmCustomCommand *)((long)name + 0x3a8);
      if (bVar1) goto LAB_003d18ee;
      name = (string *)((long)name + 0x4e0);
      lVar5 = lVar5 + -1;
      lVar3 = lVar3 + -0x4e0;
    } while (1 < lVar5);
  }
  lVar3 = (lVar3 >> 3) * 0x6f96f96f96f96f97;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      pcVar4 = (cmCustomCommand *)commands;
      if (lVar3 != 3) goto LAB_003d18ee;
      pvVar2 = cmCustomCommand::GetByproducts_abi_cxx11_((cmCustomCommand *)name);
      bVar1 = AnyOutputMatches(this,(pvVar2->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)(pvVar2->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish);
      pcVar4 = (cmCustomCommand *)name;
      if (bVar1) goto LAB_003d18ee;
      name = (string *)((long)name + 0x138);
    }
    pvVar2 = cmCustomCommand::GetByproducts_abi_cxx11_((cmCustomCommand *)name);
    bVar1 = AnyOutputMatches(this,(pvVar2->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(pvVar2->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish);
    pcVar4 = (cmCustomCommand *)name;
    if (bVar1) goto LAB_003d18ee;
    name = (string *)((long)name + 0x138);
  }
  pvVar2 = cmCustomCommand::GetByproducts_abi_cxx11_((cmCustomCommand *)name);
  bVar1 = AnyOutputMatches(this,(pvVar2->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)(pvVar2->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish);
  pcVar4 = (cmCustomCommand *)name;
  if (!bVar1) {
    pcVar4 = (cmCustomCommand *)commands;
  }
LAB_003d18ee:
  return pcVar4 != (cmCustomCommand *)commands;
}

Assistant:

bool AnyTargetCommandOutputMatches(
  const std::string& name, const std::vector<cmCustomCommand>& commands)
{
  return std::any_of(commands.begin(), commands.end(),
                     [&name](cmCustomCommand const& command) -> bool {
                       return AnyOutputMatches(name, command.GetByproducts());
                     });
}